

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ac3StreamReader.cpp
# Opt level: O0

void __thiscall
AC3StreamReader::writePESExtension(AC3StreamReader *this,PESPacket *pesPacket,AVPacket *avPacket)

{
  byte bVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  uint8_t *data;
  AVPacket *avPacket_local;
  PESPacket *pesPacket_local;
  AC3StreamReader *this_local;
  
  if ((this->m_useNewStyleAudioPES & 1U) != 0) {
    pesPacket->flagsLo = pesPacket->flagsLo | 1;
    bVar1 = PESPacket::getHeaderLength(pesPacket);
    puVar2 = &pesPacket->startCode0 + (int)(uint)bVar1;
    *puVar2 = '\x01';
    puVar3 = puVar2 + 2;
    puVar2[1] = 0x81;
    if ((((this->super_AC3Codec).m_true_hd_mode & 1U) == 0) ||
       (((this->super_AC3Codec).m_downconvertToAC3 & 1U) != 0)) {
      if ((this->super_AC3Codec).m_bsid < 0xb) {
        *puVar3 = 'q';
      }
      else {
        *puVar3 = 'r';
      }
    }
    else if ((avPacket->flags & 0x40) == 0) {
      *puVar3 = 'r';
    }
    else {
      *puVar3 = 'v';
    }
    pesPacket->m_pesHeaderLen = pesPacket->m_pesHeaderLen + '\x03';
  }
  return;
}

Assistant:

void AC3StreamReader::writePESExtension(PESPacket* pesPacket, const AVPacket& avPacket)
{
    if (m_useNewStyleAudioPES)
    {
        pesPacket->flagsLo |= 1;  // enable PES extension for AC3 stream
        uint8_t* data = reinterpret_cast<uint8_t*>(pesPacket) + pesPacket->getHeaderLength();
        *data++ = 0x01;
        *data++ = 0x81;
        if (!m_true_hd_mode || m_downconvertToAC3)
        {
            if (m_bsid > 10)
                *data = 0x72;  // E-AC3 subtype
            else
                *data = 0x71;  // AC3 subtype
        }
        else
        {
            if (avPacket.flags & AVPacket::IS_CORE_PACKET)
                *data = 0x76;  // AC3 at TRUE-HD
            else
                *data = 0x72;  // TRUE-HD data
        }
        pesPacket->m_pesHeaderLen += 3;
    }
}